

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::JsonObjectWriter::~JsonObjectWriter(JsonObjectWriter *this)

{
  if (this->m_active == true) {
    std::operator<<(this->m_os,'\n');
    JsonUtils::indent(this->m_os,this->m_indent_level);
    std::operator<<(this->m_os,'}');
  }
  return;
}

Assistant:

JsonObjectWriter::~JsonObjectWriter() {
        if ( !m_active ) { return; }

        m_os << '\n';
        JsonUtils::indent( m_os, m_indent_level );
        m_os << '}';
    }